

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

void __thiscall
Rml::ElementText::GenerateDecoration(ElementText *this,Mesh *mesh,FontFaceHandle font_face_handle)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  FontEngineInterface *pFVar4;
  undefined4 extraout_var;
  reference pLVar6;
  Vector2f local_60;
  Vector2f size;
  Vector2f position;
  Line *line;
  iterator __end1;
  iterator __begin1;
  LineList *__range1;
  float offset;
  FontMetrics *metrics;
  FontFaceHandle font_face_handle_local;
  Mesh *mesh_local;
  ElementText *this_local;
  long lVar5;
  
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->decoration);
  if ((!bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(decoration)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementText.cpp"
                     ,0x1e5), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  pFVar4 = GetFontEngineInterface();
  iVar3 = (*pFVar4->_vptr_FontEngineInterface[8])(pFVar4,font_face_handle);
  lVar5 = CONCAT44(extraout_var,iVar3);
  __range1._4_4_ = 0.0;
  switch(this->decoration_property) {
  case None:
    return;
  case Underline:
    __range1._4_4_ = *(float *)(lVar5 + 0x14);
    break;
  case Overline:
    __range1._4_4_ = *(float *)(lVar5 + 4) * -1.1;
    break;
  case LineThrough:
    __range1._4_4_ = *(float *)(lVar5 + 0x10) * -0.65;
  }
  __end1 = ::std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>::begin
                     (&this->lines);
  line = (Line *)::std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>::end
                           (&this->lines);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Rml::ElementText::Line_*,_std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>_>
                                     *)&line), bVar2) {
    pLVar6 = __gnu_cxx::
             __normal_iterator<Rml::ElementText::Line_*,_std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>_>
             ::operator*(&__end1);
    Vector2<float>::Vector2(&size,(pLVar6->position).x,(pLVar6->position).y + __range1._4_4_);
    Vector2<float>::Vector2(&local_60,(float)pLVar6->width,*(float *)(lVar5 + 0x18));
    MeshUtilities::GenerateLine(mesh,size,local_60,this->colour);
    __gnu_cxx::
    __normal_iterator<Rml::ElementText::Line_*,_std::vector<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void ElementText::GenerateDecoration(Mesh& mesh, const FontFaceHandle font_face_handle)
{
	RMLUI_ZoneScopedC(0xA52A2A);
	RMLUI_ASSERT(decoration);

	const FontMetrics& metrics = GetFontEngineInterface()->GetFontMetrics(font_face_handle);

	float offset = 0.f;
	switch (decoration_property)
	{
	case Style::TextDecoration::Underline: offset = metrics.underline_position; break;
	case Style::TextDecoration::Overline: offset = -1.1f * metrics.ascent; break;
	case Style::TextDecoration::LineThrough: offset = -0.65f * metrics.x_height; break;
	case Style::TextDecoration::None: return;
	}

	for (const Line& line : lines)
	{
		const Vector2f position = {line.position.x, line.position.y + offset};
		const Vector2f size = {(float)line.width, metrics.underline_thickness};
		MeshUtilities::GenerateLine(mesh, position, size, colour);
	}
}